

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

int IsValidExtendedFormat(WebPDemuxer *dmux)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  bool bVar3;
  bool bVar4;
  ChunkData *alpha;
  ChunkData *image;
  int cur_frame_set;
  Frame *f;
  int is_animation;
  Frame *local_20;
  int local_4;
  
  bVar3 = (*(uint *)(in_RDI + 0x30) & 2) != 0;
  local_20 = *(Frame **)(in_RDI + 0x48);
  if (*(int *)(in_RDI + 0x28) == 0) {
    local_4 = 1;
  }
  else if ((*(int *)(in_RDI + 0x34) < 1) || (*(int *)(in_RDI + 0x38) < 1)) {
    local_4 = 0;
  }
  else if (*(int *)(in_RDI + 0x3c) < 0) {
    local_4 = 0;
  }
  else if ((*(int *)(in_RDI + 0x28) == 2) && (*(long *)(in_RDI + 0x48) == 0)) {
    local_4 = 0;
  }
  else if ((*(uint *)(in_RDI + 0x30) & 0xffffffc1) == 0) {
    while (local_20 != (Frame *)0x0) {
      iVar1 = local_20->frame_num;
      while( true ) {
        bVar4 = false;
        if (local_20 != (Frame *)0x0) {
          bVar4 = local_20->frame_num == iVar1;
        }
        if (!bVar4) break;
        if ((!bVar3) && (1 < local_20->frame_num)) {
          return 0;
        }
        if (local_20->complete == 0) {
          if (*(int *)(in_RDI + 0x28) == 2) {
            return 0;
          }
          if (((local_20->img_components[1].size != 0) && (local_20->img_components[0].size != 0))
             && (local_20->img_components[0].offset < local_20->img_components[1].offset)) {
            return 0;
          }
          if (local_20->next != (Frame *)0x0) {
            return 0;
          }
        }
        else {
          if ((local_20->img_components[1].size == 0) && (local_20->img_components[0].size == 0)) {
            return 0;
          }
          if ((local_20->img_components[1].size != 0) &&
             (local_20->img_components[0].offset < local_20->img_components[1].offset)) {
            return 0;
          }
          if ((local_20->width < 1) || (local_20->height < 1)) {
            return 0;
          }
        }
        if (((0 < local_20->width) && (0 < local_20->height)) &&
           (iVar2 = CheckFrameBounds(local_20,(uint)((bVar3 ^ 0xffU) & 1),*(int *)(in_RDI + 0x34),
                                     *(int *)(in_RDI + 0x38)), iVar2 == 0)) {
          return 0;
        }
        local_20 = local_20->next;
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int IsValidExtendedFormat(const WebPDemuxer* const dmux) {
  const int is_animation = !!(dmux->feature_flags & ANIMATION_FLAG);
  const Frame* f = dmux->frames;

  if (dmux->state == WEBP_DEMUX_PARSING_HEADER) return 1;

  if (dmux->canvas_width <= 0 || dmux->canvas_height <= 0) return 0;
  if (dmux->loop_count < 0) return 0;
  if (dmux->state == WEBP_DEMUX_DONE && dmux->frames == NULL) return 0;
  if (dmux->feature_flags & ~ALL_VALID_FLAGS) return 0;  // invalid bitstream

  while (f != NULL) {
    const int cur_frame_set = f->frame_num;

    // Check frame properties.
    for (; f != NULL && f->frame_num == cur_frame_set; f = f->next) {
      const ChunkData* const image = f->img_components;
      const ChunkData* const alpha = f->img_components + 1;

      if (!is_animation && f->frame_num > 1) return 0;

      if (f->complete) {
        if (alpha->size == 0 && image->size == 0) return 0;
        // Ensure alpha precedes image bitstream.
        if (alpha->size > 0 && alpha->offset > image->offset) {
          return 0;
        }

        if (f->width <= 0 || f->height <= 0) return 0;
      } else {
        // There shouldn't be a partial frame in a complete file.
        if (dmux->state == WEBP_DEMUX_DONE) return 0;

        // Ensure alpha precedes image bitstream.
        if (alpha->size > 0 && image->size > 0 &&
            alpha->offset > image->offset) {
          return 0;
        }
        // There shouldn't be any frames after an incomplete one.
        if (f->next != NULL) return 0;
      }

      if (f->width > 0 && f->height > 0 &&
          !CheckFrameBounds(f, !is_animation,
                            dmux->canvas_width, dmux->canvas_height)) {
        return 0;
      }
    }
  }
  return 1;
}